

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

ArchKind __thiscall llvm::ARM::parseCPUArch(ARM *this,StringRef CPU)

{
  ArchKind AVar1;
  char *__n;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0x10;
  while( true ) {
    __n = *(char **)(&UNK_001d3468 + lVar3);
    AVar1 = *(ArchKind *)((long)&(anonymous_namespace)::CPUNames + lVar3);
    if (__n == CPU.Data) {
      if (__n == (char *)0x0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(this,*(void **)(&UNK_001d3460 + lVar3),(size_t)__n);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) break;
    lVar3 = lVar3 + 0x20;
    if (lVar3 == 0xa90) {
      return INVALID;
    }
  }
  return AVar1;
}

Assistant:

ARM::ArchKind llvm::ARM::parseCPUArch(StringRef CPU) {
  for (const auto C : CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ARM::ArchKind::INVALID;
}